

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

short duckdb::BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,short,short,short>
                (bool fun,short left,short right,ValidityMask *mask,idx_t idx)

{
  OutOfRangeException *this;
  allocator local_39;
  string local_38;
  
  if (right != -1 || left != -0x8000) {
    if (right == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
    }
    else {
      left = left / right;
    }
    return left;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow in division of %d / %d",&local_39);
  OutOfRangeException::OutOfRangeException<short,short>(this,&local_38,-0x8000,-1);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %d / %d", left, right);
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}